

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

ssize_t http_decode_path_unsafe(char *dest,char *url_data)

{
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    uVar1 = *url_data;
    if (uVar1 == '%') {
      iVar2 = hex2byte((uint8_t *)(dest + lVar3),(uint8_t *)url_data + 1);
      if (iVar2 != 0) {
        return -1;
      }
      url_data = (char *)((uint8_t *)url_data + 3);
    }
    else {
      if (uVar1 == '\0') {
        dest[lVar3] = '\0';
        return lVar3;
      }
      url_data = (char *)((uint8_t *)url_data + 1);
      dest[lVar3] = uVar1;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

ssize_t http_decode_path_unsafe(char *dest, const char *url_data) {
  char *pos = dest;
  while (*url_data) {
    if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}